

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O0

int pospopcnt_u16_avx2_naive_counter(uint16_t *data,uint32_t len,uint32_t *flags)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  uint uVar5;
  long lVar6;
  long lVar7;
  long in_RDX;
  uint in_ESI;
  long in_RDI;
  undefined1 auVar8 [32];
  int i_3;
  int j_1;
  size_t i_2;
  int j;
  uint16_t *d;
  int k_1;
  int p;
  int k;
  size_t i_1;
  uint32_t pos;
  uint32_t n_update_cycles;
  uint32_t n_cycles;
  __m256i *data_vectors;
  uint32_t out_counters [16];
  int i;
  __m256i counters [16];
  __m256i masks [16];
  int local_6a0;
  int local_69c;
  ulong local_698;
  int local_68c;
  int local_67c;
  uint local_678;
  int local_674;
  ulong local_670;
  uint local_664;
  int local_650 [19];
  uint local_604;
  ushort local_600 [4];
  undefined8 auStack_5f8 [130];
  long local_1e8;
  uint local_1dc;
  long local_1d8;
  undefined2 local_1c8;
  ushort local_1c6;
  undefined1 local_100 [16];
  undefined1 auStack_f0 [16];
  ushort local_e0;
  ushort local_de;
  ushort local_dc;
  ushort local_da;
  ushort local_d8;
  ushort local_d6;
  ushort local_d4;
  ushort local_d2;
  ushort local_d0;
  ushort local_ce;
  ushort local_cc;
  ushort local_ca;
  ushort local_c8;
  ushort local_c6;
  ushort local_c4;
  ushort local_c2;
  undefined1 local_c0 [32];
  undefined2 local_a0;
  undefined2 local_9e;
  undefined2 local_9c;
  undefined2 local_9a;
  undefined2 local_98;
  undefined2 local_96;
  undefined2 local_94;
  undefined2 local_92;
  undefined2 local_90;
  undefined2 local_8e;
  undefined2 local_8c;
  undefined2 local_8a;
  undefined2 local_88;
  undefined2 local_86;
  undefined2 local_84;
  undefined2 local_82;
  
  for (local_604 = 0; (int)local_604 < 0x10; local_604 = local_604 + 1) {
    uVar5 = 1 << (local_604 & 0x1f);
    local_1c6 = (ushort)uVar5;
    auVar1 = vpinsrw_avx(ZEXT216(local_1c6),uVar5 & 0xffff,1);
    auVar1 = vpinsrw_avx(auVar1,uVar5 & 0xffff,2);
    auVar1 = vpinsrw_avx(auVar1,uVar5 & 0xffff,3);
    auVar1 = vpinsrw_avx(auVar1,uVar5 & 0xffff,4);
    auVar1 = vpinsrw_avx(auVar1,uVar5 & 0xffff,5);
    auVar1 = vpinsrw_avx(auVar1,uVar5 & 0xffff,6);
    local_100 = vpinsrw_avx(auVar1,uVar5 & 0xffff,7);
    auVar1 = vpinsrw_avx(ZEXT216(local_1c6),uVar5 & 0xffff,1);
    auVar1 = vpinsrw_avx(auVar1,uVar5 & 0xffff,2);
    auVar1 = vpinsrw_avx(auVar1,uVar5 & 0xffff,3);
    auVar1 = vpinsrw_avx(auVar1,uVar5 & 0xffff,4);
    auVar1 = vpinsrw_avx(auVar1,uVar5 & 0xffff,5);
    auVar1 = vpinsrw_avx(auVar1,uVar5 & 0xffff,6);
    auStack_f0 = vpinsrw_avx(auVar1,uVar5 & 0xffff,7);
    lVar6 = (long)(int)local_604;
    auStack_5f8[lVar6 * 4 + 0x3f] = local_100._0_8_;
    auStack_5f8[lVar6 * 4 + 0x40] = local_100._8_8_;
    auStack_5f8[lVar6 * 4 + 0x41] = auStack_f0._0_8_;
    auStack_5f8[lVar6 * 4 + 0x42] = auStack_f0._8_8_;
    local_1c8 = 0;
    local_82 = 0;
    local_84 = 0;
    local_86 = 0;
    local_88 = 0;
    local_8a = 0;
    local_8c = 0;
    local_8e = 0;
    local_90 = 0;
    local_92 = 0;
    local_94 = 0;
    local_96 = 0;
    local_98 = 0;
    local_9a = 0;
    local_9c = 0;
    local_9e = 0;
    local_a0 = 0;
    auVar1 = vpinsrw_avx(ZEXT216(0),0,1);
    auVar1 = vpinsrw_avx(auVar1,0,2);
    auVar1 = vpinsrw_avx(auVar1,0,3);
    auVar1 = vpinsrw_avx(auVar1,0,4);
    auVar1 = vpinsrw_avx(auVar1,0,5);
    auVar1 = vpinsrw_avx(auVar1,0,6);
    auVar1 = vpinsrw_avx(auVar1,0,7);
    auVar2 = vpinsrw_avx(ZEXT216(0),0,1);
    auVar2 = vpinsrw_avx(auVar2,0,2);
    auVar2 = vpinsrw_avx(auVar2,0,3);
    auVar2 = vpinsrw_avx(auVar2,0,4);
    auVar2 = vpinsrw_avx(auVar2,0,5);
    auVar2 = vpinsrw_avx(auVar2,0,6);
    auVar2 = vpinsrw_avx(auVar2,0,7);
    local_c0._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
    local_c0._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
    *(undefined1 (*) [32])(local_600 + (long)(int)local_604 * 0x10) = local_c0;
    local_e0 = local_1c6;
    local_de = local_1c6;
    local_dc = local_1c6;
    local_da = local_1c6;
    local_d8 = local_1c6;
    local_d6 = local_1c6;
    local_d4 = local_1c6;
    local_d2 = local_1c6;
    local_d0 = local_1c6;
    local_ce = local_1c6;
    local_cc = local_1c6;
    local_ca = local_1c6;
    local_c8 = local_1c6;
    local_c6 = local_1c6;
    local_c4 = local_1c6;
    local_c2 = local_1c6;
  }
  local_1e8 = in_RDX;
  local_1dc = in_ESI;
  local_1d8 = in_RDI;
  memset(local_650,0,0x40);
  local_664 = 0;
  for (local_670 = 0; local_670 < local_1dc >> 0x14; local_670 = local_670 + 1) {
    for (local_674 = 0; local_674 < 0x10000; local_674 = local_674 + 1) {
      for (local_678 = 0; (int)local_678 < 0x10; local_678 = local_678 + 1) {
        lVar6 = (long)(int)local_678;
        lVar7 = (long)(int)local_678;
        auVar3._8_8_ = auStack_5f8[lVar7 * 4 + 0x40];
        auVar3._0_8_ = auStack_5f8[lVar7 * 4 + 0x3f];
        auVar3._16_8_ = auStack_5f8[lVar7 * 4 + 0x41];
        auVar3._24_8_ = auStack_5f8[lVar7 * 4 + 0x42];
        auVar8 = vpand_avx2(*(undefined1 (*) [32])(local_1d8 + (ulong)local_664 * 0x20),auVar3);
        auVar8 = vpsrlw_avx2(auVar8,ZEXT416(local_678));
        auVar4._8_8_ = auStack_5f8[lVar6 * 4];
        auVar4._0_8_ = *(undefined8 *)(local_600 + lVar6 * 0x10);
        auVar4._16_8_ = auStack_5f8[lVar6 * 4 + 1];
        auVar4._24_8_ = auStack_5f8[lVar6 * 4 + 2];
        auVar8 = vpaddw_avx2(auVar4,auVar8);
        *(undefined1 (*) [32])(local_600 + (long)(int)local_678 * 0x10) = auVar8;
      }
      local_664 = local_664 + 1;
    }
    for (local_67c = 0; local_67c < 0x10; local_67c = local_67c + 1) {
      for (local_68c = 0; local_68c < 0x10; local_68c = local_68c + 1) {
        local_650[local_67c] =
             (uint)local_600[(long)local_67c * 0x10 + (long)local_68c] + local_650[local_67c];
      }
      auVar1 = vpinsrw_avx(ZEXT216(0),0,1);
      auVar1 = vpinsrw_avx(auVar1,0,2);
      auVar1 = vpinsrw_avx(auVar1,0,3);
      auVar1 = vpinsrw_avx(auVar1,0,4);
      auVar1 = vpinsrw_avx(auVar1,0,5);
      auVar1 = vpinsrw_avx(auVar1,0,6);
      auVar1 = vpinsrw_avx(auVar1,0,7);
      auVar2 = vpinsrw_avx(ZEXT216(0),0,1);
      auVar2 = vpinsrw_avx(auVar2,0,2);
      auVar2 = vpinsrw_avx(auVar2,0,3);
      auVar2 = vpinsrw_avx(auVar2,0,4);
      auVar2 = vpinsrw_avx(auVar2,0,5);
      auVar2 = vpinsrw_avx(auVar2,0,6);
      auVar2 = vpinsrw_avx(auVar2,0,7);
      auVar8._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
      auVar8._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
      *(undefined1 (*) [32])(local_600 + (long)local_67c * 0x10) = auVar8;
    }
  }
  for (local_698 = (ulong)(local_664 << 4); local_698 < local_1dc; local_698 = local_698 + 1) {
    for (local_69c = 0; local_69c < 0x10; local_69c = local_69c + 1) {
      local_650[local_69c] =
           ((int)((uint)*(ushort *)(local_1d8 + local_698 * 2) & 1 << ((byte)local_69c & 0x1f)) >>
           ((byte)local_69c & 0x1f)) + local_650[local_69c];
    }
  }
  for (local_6a0 = 0; local_6a0 < 0x10; local_6a0 = local_6a0 + 1) {
    *(int *)(local_1e8 + (long)local_6a0 * 4) = local_650[local_6a0];
  }
  return 0;
}

Assistant:

int pospopcnt_u16_avx2_naive_counter(const uint16_t* data, uint32_t len, uint32_t* flags) {
    __m256i masks[16];
    __m256i counters[16];
    for (int i = 0; i < 16; ++i) {
        masks[i]    = _mm256_set1_epi16(1 << i);
        counters[i] = _mm256_set1_epi16(0);
    }
    uint32_t out_counters[16] = {0};

    const __m256i* data_vectors = (const __m256i*)(data);
    const uint32_t n_cycles = len / 16;
    const uint32_t n_update_cycles = n_cycles / 65536;

#define UPDATE(idx) counters[idx]  = _mm256_add_epi16(counters[idx],  _mm256_srli_epi16(_mm256_and_si256(_mm256_loadu_si256(data_vectors+pos), masks[idx]),  idx))

    uint32_t pos = 0;
    for (size_t i = 0; i < n_update_cycles; ++i) { // each block of 2^16 values
        for (int k = 0; k < 65536; ++pos,++k) { // max sum of each 16-bit value in a register
            for (int p = 0; p < 16; ++p) // Not unrolled
                UPDATE(p);
        }

        // Compute vector sum
        for (int k = 0; k < 16; ++k) { // each flag register
            // Naive counter
            uint16_t* d = (uint16_t*)(&counters[k]);
            for (int j = 0; j < 16; ++j) // each uint16_t in the register
                out_counters[k] += d[j];

            counters[k] = _mm256_set1_epi16(0);
        }
    }

    // residual
    for (size_t i = pos*16; i < len; ++i) {
        for (int j = 0; j < 16; ++j)
            out_counters[j] += ((data[i] & (1 << j)) >> j);
    }

    for (int i = 0; i < 16; ++i) flags[i] = out_counters[i];

#undef UPDATE

    return 0;
}